

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_primitive_createPointerType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_tuple_t *arguments_00;
  int64_t svalue;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_object_tuple_t *psStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  sysbvm_tuple_t local_38;
  sysbvm_tuple_t sStack_30;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  uVar4 = *arguments;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  psStack_90 = (sysbvm_object_tuple_t *)0x0;
  local_68 = 0;
  local_a8 = arguments[1];
  sStack_a0 = arguments[2];
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 9;
  local_40 = (undefined1 *)&local_a8;
  sysbvm_stackFrame_pushRecord(&local_58);
  if (sStack_a0 == 0) {
    sysbvm_error("Expected a valid address space for pointer type.");
  }
  psStack_90 = sysbvm_context_allocatePointerTuple(context,(context->roots).pointerType,0x21);
  if (((uVar4 & 0xf) == 0 && uVar4 != 0) && (0xf < *(uint *)(uVar4 + 0xc))) {
    *(sysbvm_object_tuple_t **)(uVar4 + 0x18) = psStack_90;
  }
  psStack_90[4].field_1.pointers[0] = 0x291b;
  psStack_90[3].field_1.pointers[0] = 0xb;
  sVar3 = sysbvm_array_create(context,0);
  psStack_90[2].header.identityHashAndFlags = (int)sVar3;
  psStack_90[2].header.objectSize = (int)(sVar3 >> 0x20);
  psStack_90[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).anyPointerType;
  uVar1 = context->targetWordSize;
  uVar4 = (ulong)uVar1 << 4 | 0xb;
  psStack_90[4].header.identityHashAndFlags = (int)uVar4;
  psStack_90[4].header.objectSize = (int)(uVar4 >> 0x20);
  _Var2 = sysbvm_tuple_isKindOf(context,sStack_a0,(context->roots).memberAddressSpaceType);
  psStack_90[4].header.field_0.typePointer = ((ulong)uVar1 << _Var2) << 4 | 0xb;
  psStack_90[10].header.identityHashAndFlags = (undefined4)local_a8;
  psStack_90[10].header.objectSize = local_a8._4_4_;
  psStack_90[10].field_1.pointers[0] = sStack_a0;
  local_88 = sysbvm_pointerLikeType_createPointerLikeStoreFunction
                       (context,(sysbvm_tuple_t)psStack_90,local_a8,0);
  psStack_90[0xb].header.identityHashAndFlags = (int)local_88;
  psStack_90[0xb].header.objectSize = (int)(local_88 >> 0x20);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_90,(context->roots).storeSelector,local_88);
  sStack_80 = sysbvm_pointerLikeType_createPointerLikeLoadFunction
                        (context,(sysbvm_tuple_t)psStack_90,local_a8,0);
  psStack_90[0xb].header.field_0.typePointer = sStack_80;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_90,(context->roots).loadSelector,sStack_80);
  arguments_00 = &local_38;
  local_38 = local_a8;
  sStack_30 = sStack_a0;
  local_98 = sysbvm_function_apply(context,(context->roots).referenceTypeTemplate,2,arguments_00,0);
  sVar3 = sysbvm_pointerLikeType_createPointerLikeReinterpretCast
                    (context,(sysbvm_tuple_t)psStack_90,local_98,(sysbvm_bitflags_t)arguments_00);
  local_68 = sVar3;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_90,(context->roots).underscoreSelector,sVar3);
  sVar3 = sysbvm_pointerLikeType_createAddition
                    (context,(sysbvm_tuple_t)psStack_90,(sysbvm_tuple_t)psStack_90,sVar3);
  local_78 = sVar3;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_90,(context->roots).plusSelector,sVar3);
  sStack_70 = sysbvm_pointerLikeType_createAddition
                        (context,(sysbvm_tuple_t)psStack_90,local_98,sVar3);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_90,(context->roots).subscriptSelector,sStack_70);
  sysbvm_stackFrame_popRecord(&local_58);
  return (sysbvm_tuple_t)psStack_90;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_primitive_createPointerType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    return sysbvm_type_doCreatePointerType(context, arguments[0], arguments[1], arguments[2]);
}